

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void VFilter8_SSE2(uint8_t *u,uint8_t *v,int stride,int thresh,int ithresh,int hev_thresh)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  __m128i *p1_00;
  __m128i *q0_00;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  __m128i V_7;
  __m128i U_7;
  __m128i V_6;
  __m128i U_6;
  __m128i V_5;
  __m128i U_5;
  __m128i V_4;
  __m128i U_4;
  __m128i V_3;
  __m128i U_3;
  __m128i V_2;
  __m128i U_2;
  __m128i V_1;
  __m128i U_1;
  __m128i V;
  __m128i U;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i t1;
  __m128i mask;
  __m128i *mask_00;
  __m128i *q2_00;
  __m128i *q1_00;
  __m128i *q0_01;
  __m128i *p0_00;
  __m128i *p1_01;
  __m128i *p2_00;
  __m128i *mask_01;
  undefined8 uVar30;
  
  uVar30 = *(undefined8 *)((long)in_RDI - (long)(in_EDX << 2));
  uVar1 = *(undefined8 *)((long)in_RSI - (long)(in_EDX << 2));
  mask_01 = (__m128i *)0x0;
  q0_01 = *(__m128i **)((long)in_RDI + ((long)in_EDX - (long)(in_EDX << 2)));
  p0_00 = *(__m128i **)((long)in_RSI + ((long)in_EDX - (long)(in_EDX << 2)));
  q2_00 = *(__m128i **)((long)in_RDI + ((long)(in_EDX * 2) - (long)(in_EDX << 2)));
  q1_00 = *(__m128i **)((long)in_RSI + ((long)(in_EDX * 2) - (long)(in_EDX << 2)));
  uVar2 = *(undefined8 *)((long)in_RDI + ((long)(in_EDX * 3) - (long)(in_EDX << 2)));
  uVar3 = *(undefined8 *)((long)in_RSI + ((long)(in_EDX * 3) - (long)(in_EDX << 2)));
  auVar29._8_8_ = uVar3;
  auVar29._0_8_ = uVar2;
  auVar28._8_8_ = q1_00;
  auVar28._0_8_ = q2_00;
  psubusb(auVar29,auVar28);
  auVar27._8_8_ = q1_00;
  auVar27._0_8_ = q2_00;
  auVar26._8_8_ = uVar3;
  auVar26._0_8_ = uVar2;
  psubusb(auVar27,auVar26);
  auVar25._8_8_ = p0_00;
  auVar25._0_8_ = q0_01;
  auVar24._8_8_ = uVar1;
  auVar24._0_8_ = uVar30;
  psubusb(auVar25,auVar24);
  auVar23._8_8_ = uVar1;
  auVar23._0_8_ = uVar30;
  auVar22._8_8_ = p0_00;
  auVar22._0_8_ = q0_01;
  psubusb(auVar23,auVar22);
  auVar21._8_8_ = q1_00;
  auVar21._0_8_ = q2_00;
  auVar20._8_8_ = p0_00;
  auVar20._0_8_ = q0_01;
  psubusb(auVar21,auVar20);
  auVar19._8_8_ = p0_00;
  auVar19._0_8_ = q0_01;
  auVar18._8_8_ = q1_00;
  auVar18._0_8_ = q2_00;
  psubusb(auVar19,auVar18);
  uVar1 = *in_RDI;
  uVar4 = *in_RSI;
  p1_00 = *(__m128i **)((long)in_RDI + (long)in_EDX);
  q0_00 = *(__m128i **)((long)in_RSI + (long)in_EDX);
  uVar5 = *(undefined8 *)((long)in_RDI + (long)(in_EDX * 2));
  mask_00 = *(__m128i **)((long)in_RSI + (long)(in_EDX * 2));
  p1_01 = *(__m128i **)((long)in_RDI + (long)(in_EDX * 3));
  p2_00 = *(__m128i **)((long)in_RSI + (long)(in_EDX * 3));
  auVar17._8_8_ = uVar4;
  auVar17._0_8_ = uVar1;
  auVar16._8_8_ = q0_00;
  auVar16._0_8_ = p1_00;
  psubusb(auVar17,auVar16);
  auVar15._8_8_ = q0_00;
  auVar15._0_8_ = p1_00;
  auVar14._8_8_ = uVar4;
  auVar14._0_8_ = uVar1;
  psubusb(auVar15,auVar14);
  auVar13._8_8_ = mask_00;
  auVar13._0_8_ = uVar5;
  auVar12._8_8_ = p2_00;
  auVar12._0_8_ = p1_01;
  psubusb(auVar13,auVar12);
  auVar11._8_8_ = p2_00;
  auVar11._0_8_ = p1_01;
  auVar10._8_8_ = mask_00;
  auVar10._0_8_ = uVar5;
  psubusb(auVar11,auVar10);
  auVar9._8_8_ = q0_00;
  auVar9._0_8_ = p1_00;
  auVar8._8_8_ = mask_00;
  auVar8._0_8_ = uVar5;
  psubusb(auVar9,auVar8);
  auVar7._8_8_ = mask_00;
  auVar7._0_8_ = uVar5;
  auVar6._8_8_ = q0_00;
  auVar6._0_8_ = p1_00;
  psubusb(auVar7,auVar6);
  ComplexMask_SSE2(p1_00,(__m128i *)0x0,q0_00,(__m128i *)0x0,(int)((ulong)uVar5 >> 0x20),(int)uVar5,
                   mask_00);
  DoFilter6_SSE2(p2_00,p1_01,p0_00,q0_01,q1_00,q2_00,mask_01,(int)uVar30);
  *(__m128i **)((long)in_RDI + (long)(in_EDX * -3)) = q0_01;
  *(__m128i **)((long)in_RSI + (long)(in_EDX * -3)) = p0_00;
  *(__m128i **)((long)in_RDI + (long)(in_EDX * -2)) = q2_00;
  *(__m128i **)((long)in_RSI + (long)(in_EDX * -2)) = q1_00;
  *(undefined8 *)((long)in_RDI + (long)-in_EDX) = uVar2;
  *(undefined8 *)((long)in_RSI + (long)-in_EDX) = uVar3;
  *in_RDI = uVar1;
  *in_RSI = uVar4;
  *(__m128i **)((long)in_RDI + (long)in_EDX) = p1_00;
  *(__m128i **)((long)in_RSI + (long)in_EDX) = q0_00;
  *(undefined8 *)((long)in_RDI + (long)(in_EDX * 2)) = uVar5;
  *(__m128i **)((long)in_RSI + (long)(in_EDX * 2)) = mask_00;
  return;
}

Assistant:

static void VFilter8_SSE2(uint8_t* WEBP_RESTRICT u, uint8_t* WEBP_RESTRICT v,
                          int stride, int thresh, int ithresh, int hev_thresh) {
  __m128i mask;
  __m128i t1, p2, p1, p0, q0, q1, q2;

  // Load p3, p2, p1, p0
  LOADUV_H_EDGES4(u - 4 * stride, v - 4 * stride, stride, t1, p2, p1, p0);
  MAX_DIFF1(t1, p2, p1, p0, mask);

  // Load q0, q1, q2, q3
  LOADUV_H_EDGES4(u, v, stride, q0, q1, q2, t1);
  MAX_DIFF2(t1, q2, q1, q0, mask);

  ComplexMask_SSE2(&p1, &p0, &q0, &q1, thresh, ithresh, &mask);
  DoFilter6_SSE2(&p2, &p1, &p0, &q0, &q1, &q2, &mask, hev_thresh);

  // Store
  STOREUV(p2, u, v, -3 * stride);
  STOREUV(p1, u, v, -2 * stride);
  STOREUV(p0, u, v, -1 * stride);
  STOREUV(q0, u, v, 0 * stride);
  STOREUV(q1, u, v, 1 * stride);
  STOREUV(q2, u, v, 2 * stride);
}